

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.cpp
# Opt level: O1

void pbrt::detail::stringPrintfRecursive(string *s,char *fmt)

{
  do {
    if (*fmt == '%') {
      if (fmt[1] != '%') {
        LogFatal(Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/print.cpp"
                 ,0x30,"Not enough optional values passed to Printf.");
      }
      fmt = fmt + 1;
    }
    else if (*fmt == '\0') {
      return;
    }
    fmt = fmt + 1;
    std::__cxx11::string::push_back((char)s);
  } while( true );
}

Assistant:

void stringPrintfRecursive(std::string *s, const char *fmt) {
    const char *c = fmt;
    // No args left; make sure there aren't any extra formatting
    // specifiers.
    while (*c) {
        if (*c == '%') {
            if (c[1] != '%')
                LOG_FATAL("Not enough optional values passed to Printf.");
            ++c;
        }
        *s += *c++;
    }
}